

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Table_Contains2_Test::~Table_Contains2_Test(Table_Contains2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Table, Contains2) {
  IntTable t;

  EXPECT_TRUE(t.insert(0).second);
  EXPECT_TRUE(t.contains(0));
  EXPECT_FALSE(t.contains(1));

  t.clear();
  EXPECT_FALSE(t.contains(0));
}